

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m128i convolve16_8tap_sse2(__m128i *ss,__m128i *coeffs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  longlong in_RDX;
  __m128i alVar5;
  __m128i res_4567;
  __m128i res_0123;
  __m128i res_67;
  __m128i res_45;
  __m128i res_23;
  __m128i res_01;
  __m128i *coeffs_local;
  __m128i *ss_local;
  
  auVar1 = vpmaddwd_avx((undefined1  [16])*ss,(undefined1  [16])*coeffs);
  auVar2 = vpmaddwd_avx((undefined1  [16])ss[1],(undefined1  [16])coeffs[1]);
  auVar3 = vpmaddwd_avx((undefined1  [16])ss[2],(undefined1  [16])coeffs[2]);
  auVar4 = vpmaddwd_avx((undefined1  [16])ss[3],(undefined1  [16])coeffs[3]);
  auVar1 = vpaddd_avx(auVar1,auVar2);
  auVar2 = vpaddd_avx(auVar3,auVar4);
  vpaddd_avx(auVar1,auVar2);
  alVar5[1] = in_RDX;
  alVar5[0] = (longlong)coeffs;
  return alVar5;
}

Assistant:

static inline __m128i convolve16_8tap_sse2(const __m128i ss[4],
                                           const __m128i coeffs[4]) {
  const __m128i res_01 = _mm_madd_epi16(ss[0], coeffs[0]);
  const __m128i res_23 = _mm_madd_epi16(ss[1], coeffs[1]);
  const __m128i res_45 = _mm_madd_epi16(ss[2], coeffs[2]);
  const __m128i res_67 = _mm_madd_epi16(ss[3], coeffs[3]);
  const __m128i res_0123 = _mm_add_epi32(res_01, res_23);
  const __m128i res_4567 = _mm_add_epi32(res_45, res_67);
  return _mm_add_epi32(res_0123, res_4567);
}